

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::CompilerGLSL::emit_pls(CompilerGLSL *this)

{
  pointer pPVar1;
  SPIREntryPoint *pSVar2;
  CompilerError *this_00;
  PlsRemap *input;
  pointer pPVar3;
  string sStack_48;
  
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  if (pSVar2->model == ExecutionModelFragment) {
    if ((this->options).es == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Pixel local storage only supported in OpenGL ES.");
    }
    else {
      if (299 < (this->options).version) {
        if ((this->pls_inputs).
            super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->pls_inputs).
            super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          statement<char_const(&)[27]>(this,(char (*) [27])"__pixel_local_inEXT _PLSIn");
          begin_scope(this);
          pPVar1 = (this->pls_inputs).
                   super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar3 = (this->pls_inputs).
                        super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
                        ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1;
              pPVar3 = pPVar3 + 1) {
            pls_decl_abi_cxx11_(&sStack_48,this,pPVar3);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&sStack_48,(char (*) [2])0x800eb9)
            ;
            ::std::__cxx11::string::~string((string *)&sStack_48);
          }
          end_scope_decl(this);
          statement<char_const(&)[1]>(this,(char (*) [1])0x6d490e);
        }
        if ((this->pls_outputs).
            super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->pls_outputs).
            super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          statement<char_const(&)[29]>(this,(char (*) [29])"__pixel_local_outEXT _PLSOut");
          begin_scope(this);
          pPVar1 = (this->pls_outputs).
                   super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar3 = (this->pls_outputs).
                        super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
                        ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1;
              pPVar3 = pPVar3 + 1) {
            pls_decl_abi_cxx11_(&sStack_48,this,pPVar3);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&sStack_48,(char (*) [2])0x800eb9)
            ;
            ::std::__cxx11::string::~string((string *)&sStack_48);
          }
          end_scope_decl(this);
          statement<char_const(&)[1]>(this,(char (*) [1])0x6d490e);
        }
        return;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Pixel local storage only supported in ESSL 3.0 and above.");
    }
  }
  else {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Pixel local storage only supported in fragment shaders.");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_pls()
{
	auto &execution = get_entry_point();
	if (execution.model != ExecutionModelFragment)
		SPIRV_CROSS_THROW("Pixel local storage only supported in fragment shaders.");

	if (!options.es)
		SPIRV_CROSS_THROW("Pixel local storage only supported in OpenGL ES.");

	if (options.version < 300)
		SPIRV_CROSS_THROW("Pixel local storage only supported in ESSL 3.0 and above.");

	if (!pls_inputs.empty())
	{
		statement("__pixel_local_inEXT _PLSIn");
		begin_scope();
		for (auto &input : pls_inputs)
			statement(pls_decl(input), ";");
		end_scope_decl();
		statement("");
	}

	if (!pls_outputs.empty())
	{
		statement("__pixel_local_outEXT _PLSOut");
		begin_scope();
		for (auto &output : pls_outputs)
			statement(pls_decl(output), ";");
		end_scope_decl();
		statement("");
	}
}